

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::js_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_program *p)

{
  long lVar1;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  t_program *local_20;
  t_program *p_local;
  t_js_generator *this_local;
  string *ns;
  
  local_20 = p;
  p_local = (t_program *)this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  if ((this->no_ns_ & 1U) == 0) {
    local_35 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"js",&local_59);
    t_program::get_namespace(__return_storage_ptr__,p,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string js_namespace(t_program* p) {
    if (no_ns_) {
      return "";
    }
    std::string ns = p->get_namespace("js");
    if (ns.size() > 0) {
      ns += ".";
    }

    return ns;
  }